

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::AtQuantifier
          (Parser<UTF8EncodingPolicyBase<false>,_true> *this)

{
  StandardChars<unsigned_char> *pSVar1;
  byte bVar2;
  bool bVar3;
  EncodedChar EVar4;
  uint uVar5;
  CharCount n;
  bool local_51;
  bool local_45;
  bool local_31;
  CharCount local_1c;
  CharCount saved;
  CharCount lookahead;
  Parser<UTF8EncodingPolicyBase<false>,_true> *this_local;
  
  bVar2 = ECLookahead(this,0);
  uVar5 = (uint)bVar2;
  if ((uVar5 - 0x2a < 2) || (uVar5 == 0x3f)) {
    this_local._7_1_ = true;
  }
  else if (uVar5 == 0x7b) {
    local_1c = 1;
    while( true ) {
      bVar3 = ECCanConsume(this,local_1c + 1);
      local_31 = false;
      if (bVar3) {
        pSVar1 = this->standardEncodedChars;
        EVar4 = ECLookahead(this,local_1c);
        local_31 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
      }
      if (local_31 == false) break;
      local_1c = local_1c + 1;
    }
    if ((local_1c == 1) || (bVar3 = ECCanConsume(this,local_1c + 1), !bVar3)) {
      this_local._7_1_ = false;
    }
    else {
      EVar4 = ECLookahead(this,local_1c);
      if (EVar4 == ',') {
        n = local_1c + 1;
        bVar3 = ECCanConsume(this,local_1c + 2);
        local_1c = n;
        if ((bVar3) && (EVar4 = ECLookahead(this,n), EVar4 == '}')) {
          this_local._7_1_ = true;
        }
        else {
          while( true ) {
            bVar3 = ECCanConsume(this,local_1c + 1);
            local_45 = false;
            if (bVar3) {
              pSVar1 = this->standardEncodedChars;
              EVar4 = ECLookahead(this,local_1c);
              local_45 = StandardChars<unsigned_char>::IsDigit(pSVar1,EVar4);
            }
            if (local_45 == false) break;
            local_1c = local_1c + 1;
          }
          if (local_1c == n) {
            this_local._7_1_ = false;
          }
          else {
            bVar3 = ECCanConsume(this,local_1c + 1);
            local_51 = false;
            if (bVar3) {
              EVar4 = ECLookahead(this,local_1c);
              local_51 = EVar4 == '}';
            }
            this_local._7_1_ = local_51;
          }
        }
      }
      else if (EVar4 == '}') {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::AtQuantifier()
    {
        // Could be terminating 0
        switch (ECLookahead())
        {
        case '*':
        case '+':
        case '?':
            return true;
        case '{':
            {
                CharCount lookahead = 1;
                while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                    lookahead++;
                if (lookahead == 1 || !ECCanConsume(lookahead + 1))
                    return false;
                switch (ECLookahead(lookahead))
                {
                case ',':
                    lookahead++;
                    if (ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}')
                        return true;
                    else
                    {
                        CharCount saved = lookahead;
                        while (ECCanConsume(lookahead + 1) && standardEncodedChars->IsDigit(ECLookahead(lookahead)))
                            lookahead++;
                        if (lookahead == saved)
                            return false;
                        return ECCanConsume(lookahead + 1) && ECLookahead(lookahead) == '}';
                    }
                case '}':
                    return true;
                default:
                    return false;
                }
            }
        default:
            return false;
        }
    }